

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O0

void __thiscall crnlib::symbol_codec::record_put_bits(symbol_codec *this,uint bits,uint num_bits)

{
  output_symbol local_20;
  output_symbol sym;
  uint num_bits_local;
  uint bits_local;
  symbol_codec *this_local;
  
  if ((num_bits != 0) &&
     (this->m_total_bits_written = num_bits + this->m_total_bits_written,
     (this->m_simulate_encoding & 1U) == 0)) {
    local_20.m_num_bits = (int16)num_bits;
    local_20.m_arith_prob0 = 0;
    local_20.m_bits = bits;
    sym.m_bits = num_bits;
    sym._4_4_ = bits;
    vector<crnlib::symbol_codec::output_symbol>::push_back(&this->m_output_syms,&local_20);
  }
  return;
}

Assistant:

void symbol_codec::record_put_bits(uint bits, uint num_bits)
    {
        CRNLIB_ASSERT(m_mode == cEncoding);

        CRNLIB_ASSERT(num_bits <= 25);
        CRNLIB_ASSERT(m_bit_count >= 25);

        if (!num_bits)
        {
            return;
        }

        m_total_bits_written += num_bits;

        if (!m_simulate_encoding)
        {
            output_symbol sym;
            sym.m_bits = bits;
            sym.m_num_bits = (uint16)num_bits;
            sym.m_arith_prob0 = 0;
            m_output_syms.push_back(sym);
        }
    }